

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.hpp
# Opt level: O2

void __thiscall Utils::ArgObject::ArgObject(ArgObject *this,string *_n,string *_d)

{
  this->_vptr_ArgObject = (_func_int **)&PTR__ArgObject_0011eb70;
  std::__cxx11::string::string((string *)&this->name,(string *)_n);
  std::__cxx11::string::string((string *)&this->description,(string *)_d);
  this->parsed = false;
  return;
}

Assistant:

ArgObject(const std::string& _n, const std::string& _d) :
        name(_n), description(_d), parsed(false) {}